

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawRectangleGradientEx
               (Rectangle rec,Color topLeft,Color bottomLeft,Color topRight,Color bottomRight)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 local_58;
  undefined4 uStack_54;
  
  rlSetTexture(texShapes.id);
  uVar2 = texShapesRec._8_8_;
  uVar1 = texShapesRec._0_8_;
  rlBegin(7);
  rlNormal3f(0.0,0.0,1.0);
  rlColor4ub(topLeft.r,topLeft.g,topLeft.b,topLeft.a);
  local_a8 = (float)uVar1;
  uStack_a4 = SUB84(uVar1,4);
  rlTexCoord2f(local_a8 / (float)texShapes.width,uStack_a4 / (float)texShapes.height);
  local_58 = rec.x;
  uStack_54 = rec.y;
  rlVertex2f(local_58,uStack_54);
  rlColor4ub(bottomLeft.r,bottomLeft.g,bottomLeft.b,bottomLeft.a);
  local_98 = (float)uVar2;
  uStack_94 = SUB84(uVar2,4);
  rlTexCoord2f(local_a8 / (float)texShapes.width,(uStack_94 + uStack_a4) / (float)texShapes.height);
  local_88 = rec.width;
  uStack_84 = rec.height;
  rlVertex2f(local_58,uStack_84 + uStack_54);
  rlColor4ub(topRight.r,topRight.g,topRight.b,topRight.a);
  rlTexCoord2f((local_98 + local_a8) / (float)texShapes.width,
               (uStack_94 + uStack_a4) / (float)texShapes.height);
  rlVertex2f(local_88 + local_58,uStack_84 + uStack_54);
  rlColor4ub(bottomRight.r,bottomRight.g,bottomRight.b,bottomRight.a);
  rlTexCoord2f((local_98 + local_a8) / (float)texShapes.width,uStack_a4 / (float)texShapes.height);
  rlVertex2f(local_88 + local_58,uStack_54);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawRectangleGradientEx(Rectangle rec, Color topLeft, Color bottomLeft, Color topRight, Color bottomRight)
{
    rlSetTexture(GetShapesTexture().id);
    Rectangle shapeRect = GetShapesTextureRectangle();

    rlBegin(RL_QUADS);
        rlNormal3f(0.0f, 0.0f, 1.0f);

        // NOTE: Default raylib font character 95 is a white square
        rlColor4ub(topLeft.r, topLeft.g, topLeft.b, topLeft.a);
        rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
        rlVertex2f(rec.x, rec.y);

        rlColor4ub(bottomLeft.r, bottomLeft.g, bottomLeft.b, bottomLeft.a);
        rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
        rlVertex2f(rec.x, rec.y + rec.height);

        rlColor4ub(topRight.r, topRight.g, topRight.b, topRight.a);
        rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
        rlVertex2f(rec.x + rec.width, rec.y + rec.height);

        rlColor4ub(bottomRight.r, bottomRight.g, bottomRight.b, bottomRight.a);
        rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
        rlVertex2f(rec.x + rec.width, rec.y);
    rlEnd();

    rlSetTexture(0);
}